

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::updateFtran(HEkkDual *this)

{
  reference pvVar1;
  HVector *in_RDI;
  HighsSimplexAnalysis *unaff_retaddr;
  double local_col_aq_density;
  double in_stack_00000068;
  HighsInt in_stack_00000074;
  HVector *in_stack_00000078;
  HighsSparseMatrix *in_stack_00000080;
  HighsSimplexAnalysis *in_stack_fffffffffffffff0;
  HVector *rhs;
  
  if (*(int *)&in_RDI[1].synthetic_tick == 0) {
    rhs = in_RDI;
    HighsSimplexAnalysis::simplexTimerStart
              (unaff_retaddr,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
    HVectorBase<double>::clear((HVectorBase<double> *)this);
    *(undefined1 *)
     &in_RDI[4].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = 1;
    HighsSparseMatrix::collectAj
              (in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000068);
    if ((*(byte *)(*(long *)&(in_RDI->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl
                  + 0xf1) & 1) != 0) {
      HighsSimplexAnalysis::operationRecordBefore
                (unaff_retaddr,(HighsInt)((ulong)rhs >> 0x20),(HVector *)in_stack_fffffffffffffff0,
                 (double)in_RDI);
    }
    HSimplexNla::ftran((HSimplexNla *)unaff_retaddr,rhs,(double)in_stack_fffffffffffffff0,
                       (HighsTimerClock *)in_RDI);
    if ((*(byte *)(*(long *)&(in_RDI->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl
                  + 0xf1) & 1) != 0) {
      HighsSimplexAnalysis::operationRecordAfter
                (in_stack_fffffffffffffff0,(HighsInt)((ulong)in_RDI >> 0x20),(HVector *)0x789c5e);
    }
    HEkk::updateOperationResultDensity
              ((HEkk *)(in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,
               (double)*(int *)&in_RDI[3].cwork.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.field_0x4 *
               (double)(in_RDI->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
               (double *)
               ((in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 0xa10));
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[3].iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                        (long)*(int *)&in_RDI[0xb].array.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start);
    *(value_type *)
     &in_RDI[0xb].cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = *pvVar1;
    HighsSimplexAnalysis::simplexTimerStop
              (unaff_retaddr,(HighsInt)((ulong)rhs >> 0x20),(HighsInt)rhs);
  }
  return;
}

Assistant:

void HEkkDual::updateFtran() {
  // Compute the pivotal column (FTRAN)
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  analysis->simplexTimerStart(FtranClock);
  // Clear the pivotal column and indicate that its values should be packed
  col_aq.clear();
  col_aq.packFlag = true;
  // Get the constraint matrix column by combining just one column
  // with unit multiplier
  a_matrix->collectAj(col_aq, variable_in, 1);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(kSimplexNlaFtran, col_aq,
                                    ekk_instance_.info_.col_aq_density);
  // Perform FTRAN
  simplex_nla->ftran(col_aq, ekk_instance_.info_.col_aq_density,
                     analysis->pointer_serial_factor_clocks);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaFtran, col_aq);
  const double local_col_aq_density = (double)col_aq.count * inv_solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_aq_density, ekk_instance_.info_.col_aq_density);
  // Save the pivot value computed column-wise - used for numerical checking
  alpha_col = col_aq.array[row_out];
  analysis->simplexTimerStop(FtranClock);
}